

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

int main(void)

{
  allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paVar1;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  row_type *prVar5;
  __tuple_element_t<0UL,_tuple<int>_> *p_Var6;
  row_type *prVar7;
  __tuple_element_t<0UL,_tuple<basic_string<char>_>_> *p_Var8;
  statement *psVar9;
  row_type *prVar10;
  __tuple_element_t<0UL,_tuple<int,_basic_string<char>_>_> *p_Var11;
  __tuple_element_t<1UL,_tuple<int,_basic_string<char>_>_> *p_Var12;
  row_type *prVar13;
  __tuple_element_t<0UL,_tuple<int,_vector<char,_allocator<char>_>_>_> *p_Var14;
  __tuple_element_t<1UL,_tuple<int,_vector<char,_allocator<char>_>_>_> *p_Var15;
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *qry;
  reference ppVar16;
  dynquery *qry_00;
  dynrow dVar17;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2c98;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2bd0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1170;
  undefined1 local_1148 [8];
  string col2;
  int col1;
  undefined1 local_1110 [8];
  dynrow row_3;
  dynrow_iterator __end1_3;
  dynrow_iterator __begin1_3;
  dynquery *__range1_3;
  string local_10e0;
  undefined1 local_10c0 [8];
  dynquery query1_9;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result_1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *row_2
  ;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_2;
  string local_1048;
  undefined1 local_1028 [8];
  statement insert1_2;
  int local_ff0;
  int local_fec;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_fe8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fe0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fb8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f90;
  iterator local_f68;
  size_type local_f60;
  undefined1 local_f58 [8];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  data_1;
  string local_f38;
  database local_f18;
  database db1_12;
  row_type *row_1;
  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end1_1;
  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __begin1_1;
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  string local_ec0;
  undefined1 local_ea0 [8];
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  query1_8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *row;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string local_e00;
  undefined1 local_de0 [8];
  statement insert1_1;
  int local_da8;
  int local_da4;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_da0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d98;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d70;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d48;
  iterator local_d20;
  size_type local_d18;
  undefined1 local_d10 [8];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  data;
  string local_cf0;
  database local_cd0;
  database db1_11;
  int local_ca8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  int local_c7c [2];
  allocator<char> local_c71;
  string local_c70;
  undefined1 local_c50 [8];
  query<int> query1_7;
  ostringstream os;
  database local_aa0;
  database db1_10;
  database db2_1;
  database db1_9;
  database db2;
  database db1_8;
  value_type local_a6d;
  int local_a6c;
  undefined1 local_a68 [4];
  int i;
  blob_type empty_blob;
  blob_type blob;
  string local_a30;
  undefined1 local_a10 [8];
  query_t_conflict query1_6;
  string local_9b0;
  undefined1 local_990 [8];
  statement inserter_1;
  string local_958;
  database local_938;
  database db1_7;
  query_t query_assignment;
  query_t query_copy;
  undefined1 local_868 [8];
  statement inserter_assign;
  undefined1 local_830 [8];
  statement inserter_copy;
  string local_7f8;
  undefined1 local_7d8 [8];
  query_t query1_5;
  string local_770;
  undefined1 local_750 [8];
  statement inserter;
  string local_718;
  database local_6f8;
  database db1_6;
  undefined1 local_6e8 [8];
  transaction_lock lock_1;
  undefined1 local_6d0 [8];
  transaction_lock lock;
  string local_6b8;
  undefined1 local_698 [8];
  query<int> query1_4;
  string local_658;
  undefined1 local_638 [8];
  statement insert_2;
  string local_600;
  database local_5e0;
  database db1_5;
  string local_5d0;
  undefined1 local_5b0 [8];
  query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> query1_3;
  string local_550;
  undefined1 local_530 [8];
  statement delete1;
  int local_4f8;
  allocator<char> local_4f1;
  string local_4f0;
  undefined1 local_4d0 [8];
  statement insert_1;
  string local_498;
  database local_478;
  database db1_4;
  string local_468;
  undefined1 local_448 [8];
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  query1_2;
  int local_3e0;
  allocator<char> local_3d9;
  string local_3d8;
  undefined1 local_3b8 [8];
  statement update1;
  int local_380;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  statement insert;
  string local_320;
  database local_300;
  database db1_3;
  string local_2f0;
  undefined1 local_2d0 [8];
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  query1_1;
  int local_268;
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  statement insert1;
  string local_208;
  database local_1e8;
  database db1_2;
  string local_1d8;
  undefined1 local_1b8 [8];
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  query1;
  string local_150;
  database local_130;
  database db1_1;
  int local_120;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> add2;
  int local_98 [5];
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  query<int> add1;
  database db1;
  char *table_def2;
  char *table_def;
  
  sqlib::database::database((database *)&add1.m_row,":memory:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"select ?1+?2",&local_81);
  sqlib::query<int>::query((query<int> *)local_60,(database *)&add1.m_row,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_98[0] = 3;
  add2._84_4_ = 4;
  sqlib::query<int>::operator()((query<int> *)local_60,local_98,(int *)&add2.field_0x54);
  bVar2 = has_data<sqlib::query<int>>((query<int> *)local_60);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x13);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add1) == true");
    std::operator<<(poVar4,"\n");
  }
  bVar2 = has_data<sqlib::query<int>>((query<int> *)local_60);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x14);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar5 = sqlib::query<int>::operator*((query<int> *)local_60);
  p_Var6 = std::get<0ul,int>(prVar5);
  if (*p_Var6 != 7) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x14);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*add1) == 7");
    std::operator<<(poVar4,"\n");
  }
  sqlib::query<int>::operator++((query<int> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"select ?1+?2",&local_119)
  ;
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  query((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_f8,(database *)&add1.m_row,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  local_120 = 3;
  db1_1.m_sqlite._4_4_ = 4;
  sqlib::query<std::__cxx11::string>::operator()
            (local_f8,&local_120,(int *)((long)&db1_1.m_sqlite + 4));
  bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                    ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x18);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add2) == true");
    std::operator<<(poVar4,"\n");
  }
  bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                    ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x19);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add2)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar7 = sqlib::
           query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
           operator*((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8);
  p_Var8 = std::get<0ul,std::__cxx11::string>(prVar7);
  bVar2 = std::operator==(p_Var8,"7");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x19);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*add2) == \"7\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_f8);
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~query((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         local_f8);
  sqlib::query<int>::~query((query<int> *)local_60);
  sqlib::database::~database((database *)&add1.m_row);
  sqlib::database::database(&local_130,":memory:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"create table table1 (col1 integer, col2 text)",
             (allocator<char> *)&query1.field_0x5f);
  sqlib::database::execute_sql(&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&query1.field_0x5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"select col1,col2 from table1",
             (allocator<char> *)((long)&db1_2.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_1b8,&local_130,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&db1_2.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1b8);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x23);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1) == false");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_1b8);
  sqlib::database::~database(&local_130);
  sqlib::database::database(&local_1e8,":memory:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"create table table1 (col1 integer, col2 text)",
             (allocator<char> *)(insert1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  sqlib::database::execute_sql(&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)(insert1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"insert into table1 (col1,col2) values(?1,?2)",&local_261);
  sqlib::statement::statement((statement *)local_240,&local_1e8,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  local_268 = 1;
  psVar9 = sqlib::statement::operator()((statement *)local_240,&local_268,(char (*) [6])"first");
  query1_1._92_4_ = 2;
  psVar9 = sqlib::statement::operator()(psVar9,(int *)&query1_1.field_0x5c,(char (*) [7])"second");
  query1_1.m_has_data = true;
  query1_1._89_3_ = 0;
  sqlib::statement::operator()(psVar9,(int *)&query1_1.m_has_data,(char (*) [6])"third");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"select col1,col2 from table1 order by col1 asc",
             (allocator<char> *)((long)&db1_3.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_2d0,&local_1e8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&db1_3.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2d0);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d0);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"first");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"first\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d0);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d0);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"second");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"second\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d0);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d0);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"third");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"third\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d0);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d0);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x33);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"!has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_2d0);
  sqlib::statement::~statement((statement *)local_240);
  sqlib::database::~database(&local_1e8);
  sqlib::database::database(&local_300,":memory:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"create table table1 (col1 integer, col2 text)",
             (allocator<char> *)(insert.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  sqlib::database::execute_sql(&local_300,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator
            ((allocator<char> *)(insert.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"insert into table1 (col1,col2) values(?1,?2)",&local_379);
  sqlib::statement::statement((statement *)local_358,&local_300,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  local_380 = 1;
  psVar9 = sqlib::statement::operator()
                     ((statement *)local_358,&stack0xfffffffffffffc80,(char (*) [6])"first");
  update1.super_statement_base.m_sql.field_2._12_4_ = 2;
  psVar9 = sqlib::statement::operator()
                     (psVar9,(int *)(update1.super_statement_base.m_sql.field_2._M_local_buf + 0xc),
                      (char (*) [7])"second");
  update1.super_statement_base.m_sql.field_2._8_4_ = 3;
  sqlib::statement::operator()
            (psVar9,(int *)(update1.super_statement_base.m_sql.field_2._M_local_buf + 8),
             (char (*) [6])"third");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"update table1 set col2=?1 where col1=?2",&local_3d9);
  sqlib::statement::statement((statement *)local_3b8,&local_300,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  local_3e0 = 1;
  psVar9 = sqlib::statement::operator()((statement *)local_3b8,(char (*) [4])"uno",&local_3e0);
  iVar3 = sqlib::statement::affected_rows(psVar9);
  if (iVar3 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"update1(\"uno\",1).affected_rows() == 1");
    std::operator<<(poVar4,"\n");
  }
  query1_2._92_4_ = 2;
  psVar9 = sqlib::statement::operator()
                     ((statement *)local_3b8,(char (*) [4])"dos",(int *)&query1_2.field_0x5c);
  iVar3 = sqlib::statement::affected_rows(psVar9);
  if (iVar3 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"update1(\"dos\",2).affected_rows() == 1");
    std::operator<<(poVar4,"\n");
  }
  query1_2.m_has_data = true;
  query1_2._89_3_ = 0;
  psVar9 = sqlib::statement::operator()
                     ((statement *)local_3b8,(char (*) [5])"tres",(int *)&query1_2.m_has_data);
  iVar3 = sqlib::statement::affected_rows(psVar9);
  if (iVar3 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x41);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"update1(\"tres\",3).affected_rows() == 1");
    std::operator<<(poVar4,"\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"select col1, col2 from table1 order by col1 asc",
             (allocator<char> *)((long)&db1_4.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_448,&local_300,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)((long)&db1_4.m_sqlite + 7));
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_448);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_448);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"uno");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"uno\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_448);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_448);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"dos");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"dos\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_448);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_448);
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
  if (*p_Var11 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
    std::operator<<(poVar4,"\n");
  }
  prVar10 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
  p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
  bVar2 = std::operator==(p_Var12,"tres");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"tres\"");
    std::operator<<(poVar4,"\n");
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_448);
  bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                    ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_448);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x48);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"!has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_448);
  sqlib::statement::~statement((statement *)local_3b8);
  sqlib::statement::~statement((statement *)local_358);
  sqlib::database::~database(&local_300);
  sqlib::database::database(&local_478,":memory:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"create table table1 (col1 integer, col2 text)",
             (allocator<char> *)(insert_1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  sqlib::database::execute_sql(&local_478,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator
            ((allocator<char> *)(insert_1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"insert into table1 (col1,col2) values(?1,?2)",&local_4f1);
  sqlib::statement::statement((statement *)local_4d0,&local_478,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  local_4f8 = 1;
  psVar9 = sqlib::statement::operator()
                     ((statement *)local_4d0,&stack0xfffffffffffffb08,(char (*) [6])"first");
  delete1.super_statement_base.m_sql.field_2._12_4_ = 2;
  psVar9 = sqlib::statement::operator()
                     (psVar9,(int *)(delete1.super_statement_base.m_sql.field_2._M_local_buf + 0xc),
                      (char (*) [7])"second");
  delete1.super_statement_base.m_sql.field_2._8_4_ = 3;
  sqlib::statement::operator()
            (psVar9,(int *)(delete1.super_statement_base.m_sql.field_2._M_local_buf + 8),
             (char (*) [6])"third");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"delete from table1 where col2=?1",
             (allocator<char> *)&query1_3.field_0x57);
  sqlib::statement::statement((statement *)local_530,&local_478,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&query1_3.field_0x57);
  psVar9 = sqlib::statement::operator()((statement *)local_530,(char (*) [6])"third");
  iVar3 = sqlib::statement::affected_rows(psVar9);
  if (iVar3 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x54);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"delete1(\"third\").affected_rows() == 1");
    std::operator<<(poVar4,"\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"select col2 from table1 order by col1 asc",
             (allocator<char> *)((long)&db1_5.m_sqlite + 7));
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  query((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_5b0,&local_478,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&db1_5.m_sqlite + 7));
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0);
  bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                    ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_5b0);
  if (bVar2) {
    bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                      ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b0);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5a);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar7 = sqlib::
             query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_5b0);
    p_Var8 = std::get<0ul,std::__cxx11::string>(prVar7);
    bVar2 = std::operator==(p_Var8,"first");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5a);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == \"first\"");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0);
    bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                      ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b0);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar7 = sqlib::
             query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_5b0);
    p_Var8 = std::get<0ul,std::__cxx11::string>(prVar7);
    bVar2 = std::operator==(p_Var8,"second");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == \"second\"");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0);
    bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                      ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b0);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5c);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    psVar9 = sqlib::statement::operator()((statement *)local_530,(char (*) [6])"first");
    iVar3 = sqlib::statement::affected_rows(psVar9);
    if (iVar3 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5e);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"delete1(\"first\").affected_rows() == 1");
      std::operator<<(poVar4,"\n");
    }
    psVar9 = sqlib::statement::operator()((statement *)local_530,(char (*) [7])"second");
    iVar3 = sqlib::statement::affected_rows(psVar9);
    if (iVar3 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5f);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"delete1(\"second\").affected_rows() == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator()<>((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_5b0);
    bVar2 = has_data<sqlib::query<std::__cxx11::string>>
                      ((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b0);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x62);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~query((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_5b0);
    sqlib::statement::~statement((statement *)local_530);
    sqlib::statement::~statement((statement *)local_4d0);
    sqlib::database::~database(&local_478);
    sqlib::database::database(&local_5e0,":memory:");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"create table table1 (col1 integer, col2 text)",
               (allocator<char> *)(insert_2.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    sqlib::database::execute_sql(&local_5e0,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator
              ((allocator<char> *)(insert_2.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,"insert into table1 (col1,col2) values(?1,?2)",
               (allocator<char> *)&query1_4.field_0x37);
    sqlib::statement::statement((statement *)local_638,&local_5e0,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator((allocator<char> *)&query1_4.field_0x37);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,"select col1 from table1 order by col1 asc",
               (allocator<char> *)&lock.field_0xf);
    sqlib::query<int>::query((query<int> *)local_698,&local_5e0,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&lock.field_0xf);
    sqlib::transaction_lock::transaction_lock((transaction_lock *)local_6d0,&local_5e0);
    lock_1._12_4_ = 1;
    psVar9 = sqlib::statement::operator()
                       ((statement *)local_638,(int *)&lock_1.field_0xc,(char (*) [6])"first");
    iVar3 = sqlib::statement::affected_rows(psVar9);
    if (iVar3 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6f);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"insert(1,\"first\").affected_rows() == 1");
      std::operator<<(poVar4,"\n");
    }
    lock_1.m_active = true;
    lock_1.m_commit_fail = false;
    lock_1._10_2_ = 0;
    psVar9 = sqlib::statement::operator()
                       ((statement *)local_638,(int *)&lock_1.m_active,(char (*) [7])"second");
    iVar3 = sqlib::statement::affected_rows(psVar9);
    if (iVar3 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x70);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"insert(2,\"second\").affected_rows() == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator()<>((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x73);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar5 = sqlib::query<int>::operator*((query<int> *)local_698);
    p_Var6 = std::get<0ul,int>(prVar5);
    if (*p_Var6 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x73);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x74);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar5 = sqlib::query<int>::operator*((query<int> *)local_698);
    p_Var6 = std::get<0ul,int>(prVar5);
    if (*p_Var6 != 2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x74);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x75);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::transaction_lock::~transaction_lock((transaction_lock *)local_6d0);
    sqlib::query<int>::operator()<>((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7b);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::transaction_lock::transaction_lock((transaction_lock *)local_6e8,&local_5e0);
    db1_6.m_sqlite._4_4_ = 1;
    sqlib::statement::operator()
              ((statement *)local_638,(int *)((long)&db1_6.m_sqlite + 4),(char (*) [6])"first");
    sqlib::query<int>::operator()<>((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x83);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar5 = sqlib::query<int>::operator*((query<int> *)local_698);
    p_Var6 = std::get<0ul,int>(prVar5);
    if (*p_Var6 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x83);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x84);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::query<int>::operator()<>((query<int> *)local_698);
    sqlib::transaction_lock::commit((transaction_lock *)local_6e8);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x89);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar5 = sqlib::query<int>::operator*((query<int> *)local_698);
    p_Var6 = std::get<0ul,int>(prVar5);
    if (*p_Var6 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x89);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8a);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::transaction_lock::~transaction_lock((transaction_lock *)local_6e8);
    sqlib::query<int>::operator()<>((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8e);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar5 = sqlib::query<int>::operator*((query<int> *)local_698);
    p_Var6 = std::get<0ul,int>(prVar5);
    if (*p_Var6 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8e);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++((query<int> *)local_698);
    bVar2 = has_data<sqlib::query<int>>((query<int> *)local_698);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8f);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    sqlib::query<int>::~query((query<int> *)local_698);
    sqlib::statement::~statement((statement *)local_638);
    sqlib::database::~database(&local_5e0);
    sqlib::database::database(&local_6f8,":memory:");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,"create table table1 (col1 integer, col2 text)",
               (allocator<char> *)(inserter.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    sqlib::database::execute_sql(&local_6f8,&local_718);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator
              ((allocator<char> *)(inserter.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_770,"insert into table1 (col1,col2) values(?1,?2)",
               (allocator<char> *)&query1_5.field_0x5f);
    sqlib::statement::statement((statement *)local_750,&local_6f8,&local_770);
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator((allocator<char> *)&query1_5.field_0x5f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f8,"select col1,col2 from table1 order by col1 asc",
               (allocator<char> *)
               (inserter_copy.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    sqlib::
    query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_7d8,&local_6f8,&local_7f8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               (inserter_copy.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
    inserter_copy.super_statement_base.m_sql.field_2._8_4_ = 1;
    sqlib::statement::operator()
              ((statement *)local_750,
               (int *)(inserter_copy.super_statement_base.m_sql.field_2._M_local_buf + 8),
               (char (*) [6])"first");
    sqlib::statement::statement((statement *)local_830,(statement *)local_750);
    inserter_assign.super_statement_base.m_sql.field_2._12_4_ = 2;
    sqlib::statement::operator()
              ((statement *)local_830,
               (int *)(inserter_assign.super_statement_base.m_sql.field_2._M_local_buf + 0xc),
               (char (*) [7])"second");
    sqlib::statement::statement((statement *)local_868);
    sqlib::statement::operator=((statement *)local_868,(statement *)local_750);
    query_copy._92_4_ = 3;
    sqlib::statement::operator()
              ((statement *)local_868,(int *)&query_copy.field_0x5c,(char (*) [6])"third");
    sqlib::
    query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7d8);
    bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                      ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_7d8);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa5);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query1)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    prVar10 = sqlib::
              query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_7d8);
    p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
    if (*p_Var11 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa5);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
      std::operator<<(poVar4,"\n");
    }
    prVar10 = sqlib::
              query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_7d8);
    p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
    bVar2 = std::operator==(p_Var12,"first");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa5);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"first\"");
      std::operator<<(poVar4,"\n");
    }
    sqlib::
    query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_7d8);
    bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                      ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_7d8);
    if (bVar2) {
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa6);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"second");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa6);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"second\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7d8);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_7d8);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa7);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query1)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa7);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"third");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa7);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"third\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7d8);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_7d8);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa8);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"!has_data(query1)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7d8);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_7d8);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xab);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query1)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xab);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"first");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xab);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"first\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7d8);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&query_assignment.m_has_data,
            (query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_7d8);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&query_assignment.m_has_data);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xae);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"!has_data(query_copy)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_7d8);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb0);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query1)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb0);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_7d8);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"second");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb0);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"second\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7d8);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&query_assignment.m_has_data);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&query_assignment.m_has_data);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb3);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query_copy)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&query_assignment.m_has_data);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb3);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query_copy) == 1");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&query_assignment.m_has_data);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"first");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb3);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query_copy) == \"first\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&query_assignment.m_has_data);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&query_assignment.m_has_data);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb4);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query_copy)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&query_assignment.m_has_data);
      p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
      if (*p_Var11 != 2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb4);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*query_copy) == 2");
        std::operator<<(poVar4,"\n");
      }
      prVar10 = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&query_assignment.m_has_data);
      p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
      bVar2 = std::operator==(p_Var12,"second");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb4);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<1>(*query_copy) == \"second\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&query_assignment.m_has_data);
      bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                        ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&query_assignment.m_has_data);
      if (bVar2) {
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&query_assignment.m_has_data);
        p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
        if (*p_Var11 != 3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb5);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query_copy) == 3");
          std::operator<<(poVar4,"\n");
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&query_assignment.m_has_data);
        p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
        bVar2 = std::operator==(p_Var12,"third");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb5);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query_copy) == \"third\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&query_assignment.m_has_data);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&query_assignment.m_has_data);
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb6);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"!has_data(query_copy)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&db1_7);
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&db1_7,
                    (query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_7d8);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&db1_7);
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xba);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"!has_data(query_assignment)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&db1_7);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&db1_7);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbd);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"has_data(query_assignment)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
        if (*p_Var11 != 1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbd);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query_assignment) == 1");
          std::operator<<(poVar4,"\n");
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
        bVar2 = std::operator==(p_Var12,"first");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbd);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query_assignment) == \"first\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&db1_7);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&db1_7);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbe);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"has_data(query_assignment)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
        if (*p_Var11 != 2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbe);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query_assignment) == 2");
          std::operator<<(poVar4,"\n");
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
        bVar2 = std::operator==(p_Var12,"second");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbe);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query_assignment) == \"second\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&db1_7);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&db1_7);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbf);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"has_data(query_assignment)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
        if (*p_Var11 != 3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbf);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query_assignment) == 3");
          std::operator<<(poVar4,"\n");
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&db1_7);
        p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
        bVar2 = std::operator==(p_Var12,"third");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xbf);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query_assignment) == \"third\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&db1_7);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&db1_7);
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xc0);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"!has_data(query_assignment)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_7d8);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xc2);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"has_data(query1)");
          std::operator<<(poVar4,"\n");
          exit(1);
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_7d8);
        p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
        if (*p_Var11 != 3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xc2);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
          std::operator<<(poVar4,"\n");
        }
        prVar10 = sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_7d8);
        p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
        bVar2 = std::operator==(p_Var12,"third");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xc2);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"third\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_7d8);
        bVar2 = has_data<sqlib::query<int,std::__cxx11::string>>
                          ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_7d8);
        if (!bVar2) {
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&db1_7);
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&query_assignment.m_has_data);
          sqlib::statement::~statement((statement *)local_868);
          sqlib::statement::~statement((statement *)local_830);
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7d8);
          sqlib::statement::~statement((statement *)local_750);
          sqlib::database::~database(&local_6f8);
          sqlib::database::database(&local_938,":memory:");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"create table table1 (col1 integer, col2 blob)",
                     (allocator<char> *)
                     (inserter_1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
          sqlib::database::execute_sql(&local_938,&local_958);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     (inserter_1.super_statement_base.m_sql.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9b0,"insert into table1 (col1,col2) values(?1,?2)",
                     (allocator<char> *)&query1_6.field_0x57);
          sqlib::statement::statement((statement *)local_990,&local_938,&local_9b0);
          std::__cxx11::string::~string((string *)&local_9b0);
          std::allocator<char>::~allocator((allocator<char> *)&query1_6.field_0x57);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a30,"select col1,col2 from table1 order by col1 asc",
                     (allocator<char> *)
                     &blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::query
                    ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10,&local_938,
                     &local_a30);
          std::__cxx11::string::~string((string *)&local_a30);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)
                     &empty_blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_a68);
          for (local_a6c = 0; local_a6c != 0x100; local_a6c = local_a6c + 1) {
            local_a6d = (value_type)local_a6c;
            std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)
                       &empty_blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10,&local_a6d);
          }
          db1_8.m_sqlite._4_4_ = 1;
          sqlib::statement::operator()
                    ((statement *)local_990,(int *)((long)&db1_8.m_sqlite + 4),
                     (vector<char,_std::allocator<char>_> *)
                     &empty_blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          db1_8.m_sqlite._0_4_ = 2;
          sqlib::statement::operator()
                    ((statement *)local_990,(int *)&db1_8,
                     (vector<char,_std::allocator<char>_> *)local_a68);
          sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator()<>
                    ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          bVar2 = has_data<sqlib::query<int,std::vector<char,std::allocator<char>>>>
                            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd8);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"has_data(query1)");
            std::operator<<(poVar4,"\n");
            exit(1);
          }
          prVar13 = sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator*
                              ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          p_Var14 = std::get<0ul,int,std::vector<char,std::allocator<char>>>(prVar13);
          if (*p_Var14 != 1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd8);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
            std::operator<<(poVar4,"\n");
          }
          prVar13 = sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator*
                              ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          p_Var15 = std::get<1ul,int,std::vector<char,std::allocator<char>>>(prVar13);
          bVar2 = operator==(p_Var15,(blob_type *)
                                     &empty_blob.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd8);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == blob");
            std::operator<<(poVar4,"\n");
          }
          sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
                    ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          bVar2 = has_data<sqlib::query<int,std::vector<char,std::allocator<char>>>>
                            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd9);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"has_data(query1)");
            std::operator<<(poVar4,"\n");
            exit(1);
          }
          prVar13 = sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator*
                              ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          p_Var14 = std::get<0ul,int,std::vector<char,std::allocator<char>>>(prVar13);
          if (*p_Var14 != 2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd9);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
            std::operator<<(poVar4,"\n");
          }
          prVar13 = sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator*
                              ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          p_Var15 = std::get<1ul,int,std::vector<char,std::allocator<char>>>(prVar13);
          bVar2 = operator==(p_Var15,(blob_type *)local_a68);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xd9);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == empty_blob");
            std::operator<<(poVar4,"\n");
          }
          sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
                    ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          bVar2 = has_data<sqlib::query<int,std::vector<char,std::allocator<char>>>>
                            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xda);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"!has_data(query1)");
            std::operator<<(poVar4,"\n");
            exit(1);
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_a68);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)
                     &empty_blob.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::~query
                    ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_a10);
          sqlib::statement::~statement((statement *)local_990);
          sqlib::database::~database(&local_938);
          sqlib::database::database(&db2,":memory:");
          sqlib::database::database(&db1_9,":memory:");
          sqlib::database::operator=(&db2,&db1_9);
          sqlib::database::~database(&db1_9);
          sqlib::database::~database(&db2);
          sqlib::database::database(&db2_1,":memory:");
          sqlib::database::database(&db1_10,&db2_1);
          sqlib::database::~database(&db1_10);
          sqlib::database::~database(&db2_1);
          sqlib::database::database(&local_aa0,":memory:");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&query1_7.m_row);
          sqlib::database::enable_trace(&local_aa0,(ostream *)&query1_7.m_row);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c70,"select ?1+?2",&local_c71);
          sqlib::query<int>::query((query<int> *)local_c50,&local_aa0,&local_c70);
          std::__cxx11::string::~string((string *)&local_c70);
          std::allocator<char>::~allocator(&local_c71);
          local_c7c[1] = 3;
          local_c7c[0] = 5;
          sqlib::query<int>::operator()((query<int> *)local_c50,local_c7c + 1,local_c7c);
          bVar2 = has_data<sqlib::query<int>>((query<int> *)local_c50);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xf3);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"has_data(query1)");
            std::operator<<(poVar4,"\n");
            exit(1);
          }
          prVar5 = sqlib::query<int>::operator*((query<int> *)local_c50);
          p_Var6 = std::get<0ul,int>(prVar5);
          if (*p_Var6 != 8) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xf3);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 8");
            std::operator<<(poVar4,"\n");
          }
          sqlib::query<int>::operator++((query<int> *)local_c50);
          bVar2 = has_data<sqlib::query<int>>((query<int> *)local_c50);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xf4);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"!has_data(query1)");
            std::operator<<(poVar4,"\n");
            exit(1);
          }
          std::__cxx11::ostringstream::str();
          bVar2 = std::operator==(&local_ca0,"select 3+5\n");
          std::__cxx11::string::~string((string *)&local_ca0);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xf6);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"os.str() == \"select 3+5\\n\"");
            std::operator<<(poVar4,"\n");
          }
          sqlib::database::disable_trace(&local_aa0);
          local_ca8[1] = 1;
          local_ca8[0] = 2;
          sqlib::query<int>::operator()((query<int> *)local_c50,local_ca8 + 1,local_ca8);
          std::__cxx11::ostringstream::str();
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&db1_11,"select 3+5\n");
          std::__cxx11::string::~string((string *)&db1_11);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xfb);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"os.str() == \"select 3+5\\n\"");
            std::operator<<(poVar4,"\n");
          }
          sqlib::query<int>::~query((query<int> *)local_c50);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&query1_7.m_row);
          sqlib::database::~database(&local_aa0);
          sqlib::database::database(&local_cd0,":memory:");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cf0,"create table table1 (col1 integer, col2 text)",
                     (allocator<char> *)
                     ((long)&data.
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          sqlib::database::execute_sql(&local_cd0,&local_cf0);
          std::__cxx11::string::~string((string *)&local_cf0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&data.
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          local_da0 = &local_d98;
          local_da4 = 1;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[6],_true>
                    (local_da0,&stack0xfffffffffffff25c,(char (*) [6])"first");
          local_da0 = &local_d70;
          local_da8 = 2;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[7],_true>
                    (local_da0,&stack0xfffffffffffff258,(char (*) [7])"second");
          local_da0 = &local_d48;
          insert1_1.super_statement_base.m_sql.field_2._12_4_ = 3;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[6],_true>
                    (local_da0,
                     (int *)(insert1_1.super_statement_base.m_sql.field_2._M_local_buf + 0xc),
                     (char (*) [6])"third");
          local_d20 = &local_d98;
          local_d18 = 3;
          paVar1 = (allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(insert1_1.super_statement_base.m_sql.field_2._M_local_buf + 0xb);
          std::
          allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(paVar1);
          __l_00._M_len = local_d18;
          __l_00._M_array = local_d20;
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_d10,__l_00,paVar1);
          std::
          allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(insert1_1.super_statement_base.m_sql.field_2._M_local_buf + 0xb));
          local_2bd0 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d20;
          do {
            local_2bd0 = local_2bd0 + -1;
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_2bd0);
          } while (local_2bd0 != &local_d98);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e00,"insert into table1 (col1,col2) values(?1,?2)",
                     (allocator<char> *)((long)&__range1 + 7));
          sqlib::statement::statement((statement *)local_de0,&local_cd0,&local_e00);
          std::__cxx11::string::~string((string *)&local_e00);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
          __end1 = std::
                   vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d10);
          row = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_d10);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             *)&row), bVar2) {
            ppVar16 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator*(&__end1);
            sqlib::statement::operator()((statement *)local_de0,&ppVar16->first,&ppVar16->second);
            __gnu_cxx::
            __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&__end1);
          }
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&query1_8.m_has_data);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ec0,"select col1,col2 from table1",
                     (allocator<char> *)((long)&__range1_1 + 7));
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_ea0,&local_cd0,&local_ec0);
          std::__cxx11::string::~string((string *)&local_ec0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
          qry = sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_ea0);
          __end1_1 = sqlib::begin<int,std::__cxx11::string>(qry);
          row_1 = (row_type *)sqlib::end<int,std::__cxx11::string>(qry);
          while (bVar2 = sqlib::
                         row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator!=(&__end1_1,
                                      (row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&row_1), bVar2) {
            prVar10 = sqlib::
                      row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end1_1);
            p_Var11 = std::get<0ul,int,std::__cxx11::string>(prVar10);
            p_Var12 = std::get<1ul,int,std::__cxx11::string>(prVar10);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&db1_12,p_Var11,p_Var12);
            std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&query1_8.m_has_data,(value_type *)&db1_12);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&db1_12);
            sqlib::
            row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end1_1);
          }
          bVar2 = std::operator==((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_d10,
                                  (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&query1_8.m_has_data);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x110);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"data == result");
            std::operator<<(poVar4,"\n");
          }
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_ea0);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&query1_8.m_has_data);
          sqlib::statement::~statement((statement *)local_de0);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_d10);
          sqlib::database::~database(&local_cd0);
          sqlib::database::database(&local_f18,":memory:");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f38,"create table table1 (col1 integer, col2 text)",
                     (allocator<char> *)
                     ((long)&data_1.
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          sqlib::database::execute_sql(&local_f18,&local_f38);
          std::__cxx11::string::~string((string *)&local_f38);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&data_1.
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          local_fe8 = &local_fe0;
          local_fec = 1;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[6],_true>
                    (local_fe8,&stack0xfffffffffffff014,(char (*) [6])"first");
          local_fe8 = &local_fb8;
          local_ff0 = 2;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[7],_true>
                    (local_fe8,&stack0xfffffffffffff010,(char (*) [7])"second");
          local_fe8 = &local_f90;
          insert1_2.super_statement_base.m_sql.field_2._12_4_ = 3;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_(&)[6],_true>
                    (local_fe8,
                     (int *)(insert1_2.super_statement_base.m_sql.field_2._M_local_buf + 0xc),
                     (char (*) [6])"third");
          local_f68 = &local_fe0;
          local_f60 = 3;
          paVar1 = (allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(insert1_2.super_statement_base.m_sql.field_2._M_local_buf + 0xb);
          std::
          allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(paVar1);
          __l._M_len = local_f60;
          __l._M_array = local_f68;
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_f58,__l,paVar1);
          std::
          allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(insert1_2.super_statement_base.m_sql.field_2._M_local_buf + 0xb));
          local_2c98 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f68;
          do {
            local_2c98 = local_2c98 + -1;
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_2c98);
          } while (local_2c98 != &local_fe0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1048,"insert into table1 (col1,col2) values(?1,?2)",
                     (allocator<char> *)((long)&__range1_2 + 7));
          sqlib::statement::statement((statement *)local_1028,&local_f18,&local_1048);
          std::__cxx11::string::~string((string *)&local_1048);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
          __end1_2 = std::
                     vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_f58);
          row_2 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f58);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1_2,
                                    (__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&row_2), bVar2) {
            ppVar16 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator*(&__end1_2);
            sqlib::statement::operator()((statement *)local_1028,&ppVar16->first,&ppVar16->second);
            __gnu_cxx::
            __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&__end1_2);
          }
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&query1_9.m_has_data);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10e0,"select col1,col2 from table1",
                     (allocator<char> *)((long)&__range1_3 + 7));
          sqlib::dynquery::dynquery((dynquery *)local_10c0,&local_f18,&local_10e0);
          std::__cxx11::string::~string((string *)&local_10e0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
          qry_00 = sqlib::dynquery::operator()<>((dynquery *)local_10c0);
          __end1_3 = sqlib::begin(qry_00);
          row_3._8_8_ = sqlib::end(qry_00);
          while (bVar2 = sqlib::dynrow_iterator::operator!=
                                   (&__end1_3,(dynrow_iterator *)&row_3.m_next_column), bVar2) {
            dVar17 = sqlib::dynrow_iterator::operator*(&__end1_3);
            local_1110 = (undefined1  [8])dVar17.m_prepared;
            row_3.m_prepared._0_4_ = dVar17.m_next_column;
            std::__cxx11::string::string((string *)local_1148);
            sqlib::dynrow::get<int,std::__cxx11::string>
                      ((dynrow *)local_1110,(int *)(col2.field_2._M_local_buf + 0xc),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1148);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      (&local_1170,(int *)(col2.field_2._M_local_buf + 0xc),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1148);
            std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&query1_9.m_has_data,&local_1170);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&local_1170);
            std::__cxx11::string::~string((string *)local_1148);
            sqlib::dynrow_iterator::operator++(&__end1_3);
          }
          bVar2 = std::operator==((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_f58,
                                  (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&query1_9.m_has_data);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x129);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"data == result");
            std::operator<<(poVar4,"\n");
          }
          sqlib::dynquery::~dynquery((dynquery *)local_10c0);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&query1_9.m_has_data);
          sqlib::statement::~statement((statement *)local_1028);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_f58);
          sqlib::database::~database(&local_f18);
          return 0;
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xc3);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"!has_data(query1)");
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xb5);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(query_copy)");
      std::operator<<(poVar4,"\n");
      exit(1);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xa6);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(query1)");
    std::operator<<(poVar4,"\n");
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x59);
  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
  poVar4 = std::operator<<(poVar4,"has_data(query1)");
  std::operator<<(poVar4,"\n");
  exit(1);
}

Assistant:

int main() {
  const char * const table_def = "create table table1 (col1 integer, col2 text)";
  const char * const table_def2 = "create table table1 (col1 integer, col2 blob)";

  {
    database db1(":memory:");

    query<int> add1(db1, "select ?1+?2");
    add1(3,4);

    SQLIB_CHECK(has_data(add1) == true);
    CHECK_ROW1(add1, 7);

    query<string> add2(db1, "select ?1+?2");
    add2(3,4);
    SQLIB_CHECK(has_data(add2) == true);
    CHECK_ROW1(add2, "7");
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    query<int,string> query1(db1, "select col1,col2 from table1");
    query1();

    SQLIB_CHECK(has_data(query1) == false);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");

    insert1(1,"first")(2,"second")(3,"third");

    query<int,string> query1(db1, "select col1,col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement update1(db1, "update table1 set col2=?1 where col1=?2");
    SQLIB_CHECK(update1("uno",1).affected_rows() == 1);
    SQLIB_CHECK(update1("dos",2).affected_rows() == 1);
    SQLIB_CHECK(update1("tres",3).affected_rows() == 1);

    query<int,string> query1(db1, "select col1, col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "uno");
    CHECK_ROW2(query1, 2, "dos");
    CHECK_ROW2(query1, 3, "tres");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement delete1(db1, "delete from table1 where col2=?1");
    SQLIB_CHECK(delete1("third").affected_rows() == 1);

    query<string> query1(db1, "select col2 from table1 order by col1 asc");
    query1();

    SQLIB_REQUIRE(has_data(query1));
    CHECK_ROW1(query1, "first");
    CHECK_ROW1(query1, "second");
    CHECK_DONE(query1);

    SQLIB_CHECK(delete1("first").affected_rows() == 1);
    SQLIB_CHECK(delete1("second").affected_rows() == 1);

    query1();
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query<int> query1(db1, "select col1 from table1 order by col1 asc");

    {
      // Start a transaction
      transaction_lock lock(db1);
      SQLIB_CHECK(insert(1,"first").affected_rows() == 1);
      SQLIB_CHECK(insert(2,"second").affected_rows() == 1);

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_ROW1(query1, 2);
      CHECK_DONE(query1);

      // Leave scope without commit
    }

    query1();
    CHECK_DONE(query1);

    {
      // Start another transaction
      transaction_lock lock(db1);
      insert(1,"first");

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);

      query1();
      lock.commit();

      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);
    }

    query1();
    CHECK_ROW1(query1, 1);
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    typedef query<int,string> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    inserter(1,"first");

    statement inserter_copy = inserter;
    inserter_copy(2,"second");

    statement inserter_assign;
    inserter_assign = inserter;
    inserter_assign(3,"third");

    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);

    query1();
    CHECK_ROW2(query1, 1, "first");

    query_t query_copy = query1;
    CHECK_DONE(query_copy);

    CHECK_ROW2(query1, 2, "second");

    query_copy();
    CHECK_ROW2(query_copy, 1, "first");
    CHECK_ROW2(query_copy, 2, "second");
    CHECK_ROW2(query_copy, 3, "third");
    CHECK_DONE(query_copy);

    query_t query_assignment;
    query_assignment = query1;
    CHECK_DONE(query_assignment);

    query_assignment();
    CHECK_ROW2(query_assignment, 1, "first");
    CHECK_ROW2(query_assignment, 2, "second");
    CHECK_ROW2(query_assignment, 3, "third");
    CHECK_DONE(query_assignment);

    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def2);

    typedef query<int,blob_type> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    // Prepare the blob with some data
    blob_type blob, empty_blob;
    for(int i = 0; i != 256; ++i)
      blob.push_back(static_cast<char>(i));

    inserter(1, blob);
    inserter(2, empty_blob);

    query1();
    CHECK_ROW2(query1, 1, blob);
    CHECK_ROW2(query1, 2, empty_blob);
    CHECK_DONE(query1);
  }

  // move assignment operator
  {
    database db1(":memory:"), db2(":memory:");
    db1 = std::move(db2);
  }

  // move copy constructor
  {
    database db1(":memory:");
    database db2(std::move(db1));
  }

  // trace test
  {
    database db1(":memory:");

    std::ostringstream os;
    db1.enable_trace(os);

    query<int> query1(db1, "select ?1+?2");
    query1(3,5);

    CHECK_ROW1(query1, 8);
    CHECK_DONE(query1);

    SQLIB_CHECK(os.str() == "select 3+5\n");

    db1.disable_trace();
    query1(1,2);

    SQLIB_CHECK(os.str() == "select 3+5\n");
  }

  // range test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    query<int,string> query1(db1, "select col1,col2 from table1");
    for(const auto& row : query1())
      result.push_back({ std::get<0>(row), std::get<1>(row) });

    SQLIB_CHECK(data == result);
  }

  // dynquery test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    dynquery query1(db1, "select col1,col2 from table1");
    for(auto row : query1()) {
      int col1;
      string col2;
      row.get(col1, col2);
      result.push_back({col1, col2});
    }

    SQLIB_CHECK(data == result);
  }

  return 0;
}